

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

void CMpoll_forever(CManager_conflict cm)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  __pid_t _Var4;
  pthread_t pVar5;
  long lVar6;
  pthread_t pVar7;
  long in_RDI;
  timespec ts_2;
  timespec ts_1;
  timespec ts;
  int should_exit;
  CMControlList cl;
  CManager_conflict in_stack_000000a8;
  CMControlList in_stack_000000b0;
  CMControlList in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff90;
  FILE *in_stack_ffffffffffffff98;
  CManager in_stack_ffffffffffffffa0;
  undefined4 local_48;
  CMTraceType in_stack_ffffffffffffffbc;
  CManager in_stack_ffffffffffffffc0;
  timespec local_38;
  timespec local_28;
  int local_14;
  long local_10;
  long local_8;
  
  local_10 = *(long *)(in_RDI + 0x20);
  local_14 = 0;
  local_8 = in_RDI;
  IntCManager_lock(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                   (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  if (*(int *)(*(long *)(local_8 + 0x20) + 0x50) == 0) {
    CM_init_select(in_stack_000000b0,in_stack_000000a8);
  }
  if ((0 < *(int *)(local_10 + 0xe8)) &&
     (pVar7 = *(pthread_t *)(local_10 + 0xf0), pVar5 = pthread_self(), pVar7 == pVar5)) {
    local_14 = local_14 + 1;
  }
  do {
    iVar2 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
    if (*(int *)(local_10 + 0xe4) != 0) {
      iVar3 = CMtrace_val[3];
      if (*(long *)(local_8 + 0x120) == 0) {
        iVar3 = CMtrace_init(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      }
      if (iVar3 != 0) {
        if (CMtrace_PID != 0) {
          pFVar1 = *(FILE **)(local_8 + 0x120);
          _Var4 = getpid();
          lVar6 = (long)_Var4;
          pVar7 = pthread_self();
          fprintf(pFVar1,"P%lxT%lx - ",lVar6,pVar7);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&local_48);
          fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",
                  CONCAT44(in_stack_ffffffffffffffbc,local_48),in_stack_ffffffffffffffc0);
        }
        fprintf(*(FILE **)(local_8 + 0x120),"CM Poll Forever - doing close\n");
      }
      fflush(*(FILE **)(local_8 + 0x120));
      IntCManager_unlock(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,iVar2);
      CManager_close((CManager_conflict)0x118501);
      if (local_14 == 0) {
        return;
      }
      pthread_exit((void *)0x0);
    }
    iVar2 = CMtrace_val[3];
    if (*(long *)(local_8 + 0x120) == 0) {
      iVar2 = CMtrace_init(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        in_stack_ffffffffffffffa0 = *(CManager *)(local_8 + 0x120);
        _Var4 = getpid();
        pVar7 = pthread_self();
        fprintf((FILE *)in_stack_ffffffffffffffa0,"P%lxT%lx - ",(long)_Var4,pVar7);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_28);
        fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_28.tv_sec,local_28.tv_nsec);
      }
      in_stack_ffffffffffffff98 = *(FILE **)(local_8 + 0x120);
      pVar7 = pthread_self();
      fprintf(in_stack_ffffffffffffff98,"CM Poll Forever - thread %zx doing wait\n",pVar7);
    }
    fflush(*(FILE **)(local_8 + 0x120));
    iVar3 = CMcontrol_list_wait(in_stack_ffffffffffffff80);
    iVar2 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  } while (iVar3 != -1);
  iVar3 = CMtrace_val[3];
  if (*(long *)(local_8 + 0x120) == 0) {
    iVar3 = CMtrace_init(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  if (iVar3 != 0) {
    if (CMtrace_PID != 0) {
      pFVar1 = *(FILE **)(local_8 + 0x120);
      _Var4 = getpid();
      lVar6 = (long)_Var4;
      pVar7 = pthread_self();
      fprintf(pFVar1,"P%lxT%lx - ",lVar6,pVar7);
      iVar2 = (int)((ulong)lVar6 >> 0x20);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_38);
      fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_38.tv_sec,local_38.tv_nsec);
    }
    fprintf(*(FILE **)(local_8 + 0x120),"CM Poll Forever - doing close and exit\n");
  }
  fflush(*(FILE **)(local_8 + 0x120));
  *(int *)(local_8 + 0xc) = *(int *)(local_8 + 0xc) + 1;
  IntCManager_unlock(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,iVar2);
  CManager_close((CManager_conflict)0x1183c4);
  exit(1);
}

Assistant:

static void
CMpoll_forever(CManager cm)
{
    CMControlList cl = cm->control_list;
    int should_exit = 0;
    CManager_lock(cm);
    if (!cm->control_list->select_initialized) {
	CM_init_select(cm->control_list, cm);
    }
    if (cl->has_thread > 0 && cl->server_thread == thr_thread_self()) {
	/* 
	 * if we're actually the server thread here, do a thread exit when
	 * we're done
	 */
	should_exit++;
    }
    while(!cl->closed) {
	CMtrace_out(cm, CMLowLevelVerbose, "CM Poll Forever - thread %zx doing wait\n", (size_t)thr_thread_self());
	if (CMcontrol_list_wait(cl) == -1) {
	    CMtrace_out(cm, CMLowLevelVerbose, "CM Poll Forever - doing close and exit\n");
	    /* 
	     * error.  others will free the CM too, add to the ref count 
	     * here so we can close.
	     */
	    cm->reference_count++;
	    CManager_unlock(cm);
	    CManager_close(cm);
	    exit(1);
	}
    }
    CMtrace_out(cm, CMLowLevelVerbose, "CM Poll Forever - doing close\n");
    CManager_unlock(cm);
    CManager_close(cm);
    if (should_exit != 0) thr_thread_exit(NULL);
}